

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall
amrex::FillPatchIteratorHelper::Initialize
          (FillPatchIteratorHelper *this,int boxGrow,Real time,int idx,int scomp,int ncomp,
          InterpBase *mapper)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  const_iterator __position;
  const_iterator __position_00;
  const_iterator __position_01;
  const_iterator __position_02;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  StateData *pSVar9;
  StateDescriptor *this_00;
  Long LVar10;
  pointer ppVar11;
  reference pvVar12;
  type pAVar13;
  Box *pBVar14;
  BoxList *this_01;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined4 in_R8D;
  long in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int M;
  int i_1;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *CrseBoxes;
  Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>
  *FBIDs;
  int dir_1;
  Box shbox_1;
  IntVect *iv_1;
  iterator __end6;
  iterator __begin6;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *__range6;
  Box *cbox;
  Box *fbx;
  iterator __end3;
  iterator __begin3;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range3;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *FineBoxes;
  IntVect *fine_ratio;
  bool is_periodic;
  Geometry *theGeom;
  Box *thePDomain;
  StateData *theState;
  AmrLevel *theAmrLevel;
  int l_1;
  Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
  *TheFBIDs;
  Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
  *TheFineBoxes;
  Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
  *TheCrseBoxes;
  bool Done;
  BoxList bl;
  int dir;
  Box shbox;
  IntVect *iv;
  iterator __end4;
  iterator __begin4;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *__range4;
  Box *box;
  int bxidx;
  const_iterator End;
  const_iterator it;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> pshifts;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> crse_boxes;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> unfilledThisLevel;
  BoxList unfillableThisLevel;
  BoxList tempUnfillable;
  Box result;
  IntAABoxMapValType v2;
  IntAAAFBIDMapValType v1;
  int N;
  int i;
  int l;
  bool extrap;
  IndexType *boxType;
  Box *topPDomain;
  AmrLevel *topLevel;
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  *amrLevels;
  int MyProc;
  undefined4 in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  undefined4 in_stack_fffffffffffff9f0;
  IndexType in_stack_fffffffffffff9f4;
  undefined4 in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffff9fc;
  uint in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  MultiFabCopyDescriptor *in_stack_fffffffffffffa08;
  StateData *in_stack_fffffffffffffa10;
  BoxList *in_stack_fffffffffffffa18;
  iterator in_stack_fffffffffffffa20;
  Box *in_stack_fffffffffffffa28;
  StateData *in_stack_fffffffffffffa30;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  in_stack_fffffffffffffa38;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  in_stack_fffffffffffffa40;
  const_iterator in_stack_fffffffffffffa48;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_fffffffffffffa88;
  Box *in_stack_fffffffffffffa90;
  BoxList *in_stack_fffffffffffffa98;
  iterator in_stack_fffffffffffffaa0;
  undefined8 *in_stack_fffffffffffffad8;
  Box *in_stack_fffffffffffffae0;
  Box *in_stack_fffffffffffffae8;
  __enable_if_t<is_constructible<value_type,_pair<const_int,_Vector<Vector<Box>_>_>_&>::value,_iterator>
  in_stack_fffffffffffffaf0;
  BoxList *in_stack_fffffffffffffaf8;
  __enable_if_t<is_constructible<value_type,_pair<const_int,_Vector<Vector<Box>_>_>_&>::value,_iterator>
  in_stack_fffffffffffffb00;
  MultiFabCopyDescriptor *in_stack_fffffffffffffb08;
  StateData *in_stack_fffffffffffffb10;
  long *in_stack_fffffffffffffb30;
  int local_484;
  int local_470;
  Box local_46c;
  reference local_450;
  IntVect *local_448;
  __normal_iterator<amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_440;
  undefined1 *local_438;
  Box local_42c;
  Box *local_410;
  reference local_408;
  Box *local_400;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  char *in_stack_fffffffffffffc20;
  IntVect *pIVar15;
  int local_3ac;
  Box local_360;
  int local_340;
  Box local_33c;
  reference local_320;
  IntVect *local_318;
  __normal_iterator<amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_310;
  undefined1 *local_308;
  Box *local_300;
  int local_2f4;
  iterator local_2f0;
  _Rb_tree_const_iterator<std::pair<const_int,_amrex::Box>_> local_2e8;
  iterator local_2e0;
  _Rb_tree_const_iterator<std::pair<const_int,_amrex::Box>_> local_2d8 [2];
  undefined1 local_2c8 [48];
  BoxList local_298;
  undefined1 local_278 [120];
  undefined4 uStack_200;
  undefined4 local_1fc;
  undefined4 uStack_1f8;
  undefined8 uStack_1f4;
  pair<const_int,_amrex::Box> local_1e8;
  iterator local_1c8;
  _Rb_tree_const_iterator<std::pair<const_int,_amrex::Box>_> local_1c0;
  iterator local_1b8;
  _Rb_tree_const_iterator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>
  local_1b0;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_1a8;
  iterator local_1a0;
  _Rb_tree_const_iterator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>
  local_198;
  _Base_ptr local_190;
  undefined1 local_188 [96];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  int local_ec;
  int local_e8;
  int local_e4;
  byte local_dd;
  uint local_dc;
  uint *local_d8;
  Box *local_d0;
  type local_c8;
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  *local_c0;
  int local_b4;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  char *local_80;
  undefined4 local_74;
  char *local_70;
  char *local_68;
  int local_5c;
  undefined8 *local_58;
  uint *local_50;
  uint *local_48;
  int local_3c;
  reference local_38;
  int local_2c;
  reference local_28;
  int local_1c;
  reference local_18;
  int local_c;
  reference local_8;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffffc10 >> 0x20);
  local_98 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_a4 = in_R8D;
  local_a0 = in_ECX;
  local_9c = in_EDX;
  local_8c = in_ESI;
  if (in_R9 == 0) {
    lVar8 = 0;
  }
  else {
    lVar8 = __dynamic_cast(in_R9,&InterpBase::typeinfo,&Interpolater::typeinfo,0);
  }
  in_RDI[0xf] = lVar8;
  if (in_RDI[0xf] == 0) {
    local_68 = "m_map";
    local_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Amr/AMReX_AmrLevel.cpp"
    ;
    local_74 = 0x2ec;
    local_80 = "\"Cannot use MFInterpolater without proper nesting\"";
    Assert_host(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,iVar7,
                (char *)in_stack_fffffffffffffc08._M_current);
  }
  in_RDI[0x16] = local_98;
  *(undefined4 *)(in_RDI + 0x17) = local_8c;
  *(undefined4 *)((long)in_RDI + 0xbc) = local_9c;
  *(undefined4 *)(in_RDI + 0x18) = local_a0;
  *(undefined4 *)((long)in_RDI + 0xc4) = local_a4;
  bVar5 = NeedToTouchUpPhysCorners
                    ((Geometry *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0)
                    );
  *(bool *)(in_RDI + 0x19) = bVar5;
  local_b4 = ParallelDescriptor::MyProc();
  local_c0 = Amr::getAmrLevels(*(Amr **)(*in_RDI + 0x150));
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
               CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  local_c8 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator*
                       ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                        CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0));
  pSVar9 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                     ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                      CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                      CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  local_d0 = StateData::getDomain(pSVar9);
  FabArrayBase::boxArray((FabArrayBase *)in_RDI[1]);
  local_dc = (uint)BoxArray::ixType((BoxArray *)
                                    CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  local_d8 = &local_dc;
  this_00 = DescriptorList::operator[]
                      ((DescriptorList *)
                       CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                       in_stack_fffffffffffff9ec);
  local_dd = StateDescriptor::extrap(this_00);
  for (local_e4 = 0; local_e4 <= *(int *)(*in_RDI + 8); local_e4 = local_e4 + 1) {
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
              ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)0x1397de2);
    Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
               CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    in_stack_fffffffffffffb30 = in_RDI + 2;
    Vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    StateData::RegisterData
              (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
               (Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
  }
  local_e8 = 0;
  FabArrayBase::boxArray((FabArrayBase *)in_RDI[1]);
  LVar10 = BoxArray::size((BoxArray *)0x1397e82);
  local_ec = (int)LVar10;
  for (; local_e8 < local_ec; local_e8 = local_e8 + 1) {
    FabArrayBase::DistributionMap((FabArrayBase *)in_RDI[1]);
    iVar7 = DistributionMapping::operator[]
                      ((DistributionMapping *)
                       CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                       in_stack_fffffffffffff9ec);
    if (iVar7 == local_b4) {
      local_128 = 0;
      uStack_120 = 0;
      local_118 = 0;
      Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
      ::Vector((Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                *)0x1397ef7);
      std::
      pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>
      ::
      pair<int_&,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>,_true>
                ((pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                 (int *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                 (Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                  *)0x1397f14);
      Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
      ::~Vector((Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                 *)0x1397f23);
      in_stack_fffffffffffffb10 = (StateData *)(in_RDI + 0x26);
      local_188._56_8_ =
           std::
           map<int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>_>
           ::end((map<int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      std::
      _Rb_tree_const_iterator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>
      ::_Rb_tree_const_iterator
                ((_Rb_tree_const_iterator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>
                  *)(local_188 + 0x40),(iterator *)(local_188 + 0x38));
      __position._M_node._4_4_ = in_stack_fffffffffffff9fc;
      __position._M_node._0_4_ = in_stack_fffffffffffff9f8;
      local_188._72_8_ =
           std::
           map<int,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>>>
           ::
           insert<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>,std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>,std::allocator<amrex::Vector<amrex::FillBoxId,std::allocator<amrex::FillBoxId>>>>>>>&>
                     ((map<int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                      __position,
                      (pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      std::
      _Rb_tree_iterator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>
                    *)0x1397fa0);
      std::
      vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
      ::resize((vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
      local_188._0_8_ = (pointer)0x0;
      local_188._8_8_ = (pointer)0x0;
      local_188._16_8_ = (pointer)0x0;
      in_stack_fffffffffffffb08 = (MultiFabCopyDescriptor *)local_188;
      Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
      ::Vector((Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                *)0x1397fed);
      std::
      pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>
      ::
      pair<int_&,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_true>
                ((pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                 (int *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                 (Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                  *)0x139800a);
      Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
      ::~Vector((Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                 *)0x1398019);
      in_stack_fffffffffffffaf8 = (BoxList *)(in_RDI + 0x1a);
      local_1a0._M_node =
           (_Base_ptr)
           std::
           map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
           ::end((map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      std::
      _Rb_tree_const_iterator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>
      ::_Rb_tree_const_iterator(&local_198,&local_1a0);
      __position_00._M_node._4_4_ = in_stack_fffffffffffff9fc;
      __position_00._M_node._0_4_ = in_stack_fffffffffffff9f8;
      in_stack_fffffffffffffb00 =
           std::
           map<int,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>>
           ::
           insert<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>&>
                     ((map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                      __position_00,
                      (pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      local_190 = in_stack_fffffffffffffb00._M_node;
      std::
      _Rb_tree_iterator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>
                    *)0x1398096);
      std::
      vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
      ::resize((vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
      in_stack_fffffffffffffae8 = (Box *)(in_RDI + 0x20);
      local_1b8._M_node =
           (_Base_ptr)
           std::
           map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
           ::end((map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      std::
      _Rb_tree_const_iterator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>
      ::_Rb_tree_const_iterator(&local_1b0,&local_1b8);
      __position_01._M_node._4_4_ = in_stack_fffffffffffff9fc;
      __position_01._M_node._0_4_ = in_stack_fffffffffffff9f8;
      in_stack_fffffffffffffaf0 =
           std::
           map<int,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>,std::less<int>,std::allocator<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>>>
           ::
           insert<std::pair<int_const,amrex::Vector<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>,std::allocator<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>>>&>
                     ((map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                      __position_01,
                      (pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      local_1a8._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
      _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
           (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
           in_stack_fffffffffffffaf0;
      std::
      _Rb_tree_iterator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>
                    *)0x1398134);
      std::
      vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
      ::resize((vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
      local_1c8._M_node =
           (_Base_ptr)
           std::
           map<int,_amrex::Box,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Box>_>_>
           ::end((map<int,_amrex::Box,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Box>_>_>
                  *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      std::_Rb_tree_const_iterator<std::pair<const_int,_amrex::Box>_>::_Rb_tree_const_iterator
                (&local_1c0,&local_1c8);
      FabArrayBase::boxArray((FabArrayBase *)in_RDI[1]);
      in_stack_fffffffffffffad8 = (undefined8 *)(local_278 + 0x54);
      BoxArray::operator[]
                ((BoxArray *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                 in_stack_fffffffffffff9fc);
      local_5c = (int)in_RDI[0x17];
      local_278._112_8_ = *in_stack_fffffffffffffad8;
      uStack_1f4 = *(undefined8 *)((long)in_stack_fffffffffffffad8 + 0x14);
      uStack_1f8 = (undefined4)
                   ((ulong)*(undefined8 *)((long)in_stack_fffffffffffffad8 + 0xc) >> 0x20);
      uStack_200 = (undefined4)in_stack_fffffffffffffad8[1];
      local_1fc = (undefined4)((ulong)in_stack_fffffffffffffad8[1] >> 0x20);
      in_stack_fffffffffffffae0 = (Box *)(local_278 + 0x70);
      local_58 = in_stack_fffffffffffffad8;
      Box::grow(in_stack_fffffffffffffae0,local_5c);
      std::pair<const_int,_amrex::Box>::pair<int_&,_amrex::Box,_true>
                (&local_1e8,&local_e8,in_stack_fffffffffffffae0);
      __position_02._M_node._4_4_ = in_stack_fffffffffffff9fc;
      __position_02._M_node._0_4_ = in_stack_fffffffffffff9f8;
      local_278._72_8_ =
           std::
           map<int,_amrex::Box,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Box>_>_>
           ::insert((map<int,_amrex::Box,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Box>_>_>
                     *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                    __position_02,
                    (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      std::
      pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>
      ::~pair((pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>
               *)0x139827e);
      std::
      pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>
      ::~pair((pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>
               *)0x139828b);
    }
  }
  local_278._36_4_ = *local_d8;
  BoxList::BoxList((BoxList *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                   in_stack_fffffffffffff9f4);
  local_298._28_4_ = *local_d8;
  BoxList::BoxList((BoxList *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                   in_stack_fffffffffffff9f4);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x139838c);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x1398399);
  std::allocator<amrex::IntVect>::allocator((allocator<amrex::IntVect> *)0x13983ae);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
             CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
             CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
             (allocator_type *)0x13983c8);
  std::allocator<amrex::IntVect>::~allocator((allocator<amrex::IntVect> *)0x13983d7);
  local_2e0._M_node =
       (_Base_ptr)
       std::map<int,_amrex::Box,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Box>_>_>
       ::begin((map<int,_amrex::Box,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Box>_>_>
                *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::_Rb_tree_const_iterator<std::pair<const_int,_amrex::Box>_>::_Rb_tree_const_iterator
            (local_2d8,&local_2e0);
  local_2f0._M_node =
       (_Base_ptr)
       std::map<int,_amrex::Box,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Box>_>_>
       ::end((map<int,_amrex::Box,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Box>_>_>
              *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::_Rb_tree_const_iterator<std::pair<const_int,_amrex::Box>_>::_Rb_tree_const_iterator
            (&local_2e8,&local_2f0);
  while (bVar5 = std::operator!=(local_2d8,&local_2e8), bVar5) {
    ppVar11 = std::_Rb_tree_const_iterator<std::pair<const_int,_amrex::Box>_>::operator->
                        ((_Rb_tree_const_iterator<std::pair<const_int,_amrex::Box>_> *)0x139846c);
    local_2f4 = ppVar11->first;
    ppVar11 = std::_Rb_tree_const_iterator<std::pair<const_int,_amrex::Box>_>::operator->
                        ((_Rb_tree_const_iterator<std::pair<const_int,_amrex::Box>_> *)0x1398482);
    local_300 = &ppVar11->second;
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::clear
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x13984a3);
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
               CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
               (value_type *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    bVar5 = Box::contains(local_d0,local_300);
    pBVar14 = local_d0;
    if (!bVar5) {
      pvVar12 = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::back
                          ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                           CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0));
      Box::operator&=(pvVar12,pBVar14);
      bVar5 = Geometry::isAnyPeriodic
                        ((Geometry *)
                         CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0));
      if (bVar5) {
        Geometry::periodicShift
                  ((Geometry *)in_stack_fffffffffffffaa0._M_current,(Box *)in_stack_fffffffffffffa98
                   ,in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        local_308 = local_2c8;
        local_310._M_current =
             (IntVect *)
             std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin
                       ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                        CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        local_318 = (IntVect *)
                    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end
                              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        while (bVar5 = __gnu_cxx::operator!=
                                 ((__normal_iterator<amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff9f4.itype,
                                              in_stack_fffffffffffff9f0),
                                  (__normal_iterator<amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8)),
              bVar5) {
          local_320 = __gnu_cxx::
                      __normal_iterator<amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                      ::operator*(&local_310);
          Box::operator+((Box *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                         (IntVect *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
          Box::operator&=(&local_33c,local_d0);
          local_48 = local_d8;
          if (*local_d8 == 7) {
            for (local_340 = 0; local_340 < 3; local_340 = local_340 + 1) {
              local_8 = local_320;
              local_c = local_340;
              if (local_320->vect[local_340] < 1) {
                local_18 = local_320;
                local_1c = local_340;
                if (local_320->vect[local_340] < 0) {
                  Box::growLo(&local_33c,local_340,-1);
                }
              }
              else {
                Box::growHi(&local_33c,local_340,-1);
              }
            }
          }
          bVar5 = Box::ok(&local_33c);
          if (bVar5) {
            boxDiff((Box *)in_stack_fffffffffffffa18,(Box *)in_stack_fffffffffffffa10);
            in_stack_fffffffffffffa98 = &local_298;
            std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
                      ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                       CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
            __gnu_cxx::
            __normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>
            ::__normal_iterator<amrex::Box*>
                      ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                       (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
            in_stack_fffffffffffffa90 = &local_360;
            BoxList::begin((BoxList *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8))
            ;
            BoxList::end((BoxList *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
            in_stack_fffffffffffffaa0 =
                 std::vector<amrex::Box,std::allocator<amrex::Box>>::
                 insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,void>
                           ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                            in_stack_fffffffffffffa30,in_stack_fffffffffffffa48,
                            in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
            BoxList::~BoxList((BoxList *)0x1398818);
          }
          __gnu_cxx::
          __normal_iterator<amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
          ::operator++(&local_310);
        }
      }
    }
    bVar4 = 0;
    in_stack_fffffffffffffa88 =
         (Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
         std::
         map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
         ::operator[]((map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
                       *)in_stack_fffffffffffffa30,(key_type *)in_stack_fffffffffffffa28);
    std::
    map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
    ::operator[]((map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffa30,(key_type *)in_stack_fffffffffffffa28);
    std::
    map<int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>_>
    ::operator[]((map<int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffa30,(key_type *)in_stack_fffffffffffffa28);
    local_3ac = *(int *)(*in_RDI + 8);
    while( true ) {
      bVar5 = false;
      if (-1 < local_3ac) {
        bVar5 = (bool)(bVar4 ^ 1);
      }
      if (!bVar5) break;
      BoxList::clear((BoxList *)0x1398957);
      Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                   CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      pAVar13 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator*
                          ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                           CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0));
      pSVar9 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                         ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                          CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                          CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      pBVar14 = StateData::getDomain(pSVar9);
      bVar5 = Geometry::isAnyPeriodic
                        ((Geometry *)
                         CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0));
      pIVar15 = &pAVar13->fine_ratio;
      Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                   CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator=
                ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                 CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                 (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::clear
                ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x1398a4f);
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin
                ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      local_400 = (Box *)std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
                                   ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                    CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      while (bVar6 = __gnu_cxx::operator!=
                               ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff9f4.itype,
                                            in_stack_fffffffffffff9f0),
                                (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8)),
            bVar6) {
        local_408 = __gnu_cxx::
                    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    ::operator*((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                 *)&stack0xfffffffffffffc08);
        std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                  ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                   CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                   (value_type *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        if (local_3ac != *(int *)(*in_RDI + 8)) {
          (**(code **)(*(long *)in_RDI[0xf] + 0x18))
                    (&local_42c,(long *)in_RDI[0xf],local_408,pIVar15);
          local_410 = &local_42c;
          pvVar12 = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::back
                              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                               CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0));
          *(undefined8 *)(pvVar12->smallend).vect = local_42c.smallend.vect._0_8_;
          *(undefined8 *)((pvVar12->smallend).vect + 2) = local_42c._8_8_;
          *(undefined8 *)((pvVar12->bigend).vect + 1) = local_42c.bigend.vect._4_8_;
          (pvVar12->btype).itype = local_42c.btype.itype;
          if ((bVar5) && (bVar6 = Box::contains(pBVar14,local_410), !bVar6)) {
            Geometry::periodicShift
                      ((Geometry *)in_stack_fffffffffffffaa0._M_current,
                       (Box *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                       in_stack_fffffffffffffa88);
            local_438 = local_2c8;
            local_440._M_current =
                 (IntVect *)
                 std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin
                           ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                            CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
            local_448 = (IntVect *)
                        std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end
                                  ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                   CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
            while (bVar6 = __gnu_cxx::operator!=
                                     ((__normal_iterator<amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                       *)CONCAT44(in_stack_fffffffffffff9f4.itype,
                                                  in_stack_fffffffffffff9f0),
                                      (__normal_iterator<amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                       *)CONCAT44(in_stack_fffffffffffff9ec,
                                                  in_stack_fffffffffffff9e8)), bVar6) {
              local_450 = __gnu_cxx::
                          __normal_iterator<amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                          ::operator*(&local_440);
              Box::operator+((Box *)CONCAT44(in_stack_fffffffffffff9f4.itype,
                                             in_stack_fffffffffffff9f0),
                             (IntVect *)
                             CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
              Box::operator&=(&local_46c,pBVar14);
              local_50 = local_d8;
              if (*local_d8 == 7) {
                for (local_470 = 0; local_470 < 3; local_470 = local_470 + 1) {
                  local_28 = local_450;
                  local_2c = local_470;
                  if (local_450->vect[local_470] < 1) {
                    local_38 = local_450;
                    local_3c = local_470;
                    if (local_450->vect[local_470] < 0) {
                      Box::growLo(&local_46c,local_470,-1);
                    }
                  }
                  else {
                    Box::growHi(&local_46c,local_470,-1);
                  }
                }
              }
              bVar6 = Box::ok(&local_46c);
              if (bVar6) {
                std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                          ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                           CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                           (value_type *)
                           CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
              }
              __gnu_cxx::
              __normal_iterator<amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
              ::operator++(&local_440);
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
        operator++((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    *)&stack0xfffffffffffffc08);
      }
      Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                   CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      this_01 = (BoxList *)
                Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                ::operator[]((Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                             CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      Vector<amrex::Box,_std::allocator<amrex::Box>_>::size
                ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x1398df5);
      std::
      vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>
      ::resize((vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>
                *)in_stack_fffffffffffffa10,(size_type)in_stack_fffffffffffffa08);
      Vector<amrex::Box,_std::allocator<amrex::Box>_>::size
                ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x1398e1e);
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::resize
                ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffffa10,
                 (size_type)in_stack_fffffffffffffa08);
      local_484 = 0;
      LVar10 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::size
                         ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x1398e45);
      for (; local_484 < (int)LVar10; local_484 = local_484 + 1) {
        in_stack_fffffffffffffa28 =
             Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                       ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                        CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                        CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        pBVar14 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                             CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                             CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        uVar1 = *(undefined8 *)(in_stack_fffffffffffffa28->smallend).vect;
        uVar2 = *(undefined8 *)((in_stack_fffffffffffffa28->smallend).vect + 2);
        uVar3 = *(undefined8 *)((in_stack_fffffffffffffa28->bigend).vect + 2);
        *(undefined8 *)(pBVar14->bigend).vect =
             *(undefined8 *)(in_stack_fffffffffffffa28->bigend).vect;
        *(undefined8 *)((pBVar14->bigend).vect + 2) = uVar3;
        *(undefined8 *)(pBVar14->smallend).vect = uVar1;
        *(undefined8 *)((pBVar14->smallend).vect + 2) = uVar2;
        in_stack_fffffffffffffa38._M_current = (Box *)(in_RDI + 2);
        in_stack_fffffffffffffa30 = pSVar9;
        in_stack_fffffffffffffa40._M_current =
             (Box *)Vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
                    ::operator[]((Vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff9f4.itype,
                                             in_stack_fffffffffffff9f0),
                                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        in_stack_fffffffffffffa48._M_current =
             (Box *)Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>
                    ::operator[]((Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff9f4.itype,
                                             in_stack_fffffffffffff9f0),
                                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                  ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                   CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                   CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        in_stack_fffffffffffff9e8 = (undefined4)in_RDI[0x18];
        in_stack_fffffffffffff9f8 = *(undefined4 *)((long)in_RDI + 0xc4);
        in_stack_fffffffffffffa00 = local_dd & 1;
        in_stack_fffffffffffff9f0 = 0;
        StateData::InterpAddBox
                  (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                   (Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
                   in_stack_fffffffffffffb00._M_node,in_stack_fffffffffffffaf8,
                   (Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                   in_stack_fffffffffffffaf0._M_node,in_stack_fffffffffffffae8,
                   (Real)in_stack_fffffffffffffae0,(int)in_stack_fffffffffffffb30,(int)lVar8,
                   (int)in_RDI,SUB81((ulong)in_stack_fffffffffffffad8 >> 0x38,0));
        BoxList::catenate((BoxList *)in_stack_fffffffffffffa20._M_current,in_stack_fffffffffffffa18)
        ;
      }
      BoxList::intersect(this_01,in_stack_fffffffffffffa48._M_current);
      bVar5 = BoxList::isEmpty((BoxList *)0x1398fbf);
      if (bVar5) {
        bVar4 = 1;
      }
      else {
        in_stack_fffffffffffffa18 = &local_298;
        std::vector<amrex::Box,_std::allocator<amrex::Box>_>::clear
                  ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x1398fe4);
        std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
                  ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                   CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        __gnu_cxx::
        __normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>::
        __normal_iterator<amrex::Box*>
                  ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    *)CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0),
                   (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        in_stack_fffffffffffffa10 = (StateData *)local_278;
        BoxList::begin((BoxList *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        BoxList::end((BoxList *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        in_stack_fffffffffffffa20 =
             std::vector<amrex::Box,std::allocator<amrex::Box>>::
             insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,void>
                       ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffffa30
                        ,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                        in_stack_fffffffffffffa38);
      }
      local_3ac = local_3ac + -1;
    }
    std::_Rb_tree_const_iterator<std::pair<const_int,_amrex::Box>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_amrex::Box>_> *)
               CONCAT44(in_stack_fffffffffffff9f4.itype,in_stack_fffffffffffff9f0));
  }
  FabArrayCopyDescriptor<amrex::FArrayBox>::CollectData
            ((FabArrayCopyDescriptor<amrex::FArrayBox> *)0x13990aa);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~Vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x13990b9);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::~Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x13990c6);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::~Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x13990d3);
  BoxList::~BoxList((BoxList *)0x13990e0);
  BoxList::~BoxList((BoxList *)0x13990ed);
  return;
}

Assistant:

void
FillPatchIteratorHelper::Initialize (int           boxGrow,
                                     Real          time,
                                     int           idx,
                                     int           scomp,
                                     int           ncomp,
                                     InterpBase*   mapper)
{
    BL_PROFILE("FillPatchIteratorHelper::Initialize()");

    BL_ASSERT(mapper);
    BL_ASSERT(scomp >= 0);
    BL_ASSERT(ncomp >= 1);
    BL_ASSERT(AmrLevel::desc_lst[idx].inRange(scomp,ncomp));
    BL_ASSERT(0 <= idx && idx < AmrLevel::desc_lst.size());

    m_map          = dynamic_cast<Interpolater*>(mapper);
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(m_map, "Cannot use MFInterpolater without proper nesting");
    m_time         = time;
    m_growsize     = boxGrow;
    m_index        = idx;
    m_scomp        = scomp;
    m_ncomp        = ncomp;
    m_FixUpCorners = NeedToTouchUpPhysCorners(m_amrlevel.geom);

    const int         MyProc     = ParallelDescriptor::MyProc();
    auto&             amrLevels  = m_amrlevel.parent->getAmrLevels();
    const AmrLevel&   topLevel   = *amrLevels[m_amrlevel.level];
    const Box&        topPDomain = topLevel.state[m_index].getDomain();
    const IndexType&  boxType    = m_leveldata.boxArray().ixType();
    const bool        extrap     = AmrLevel::desc_lst[m_index].extrap();
    //
    // Check that the interpolaters are identical.
    //
    BL_ASSERT(AmrLevel::desc_lst[m_index].identicalInterps(scomp,ncomp));

    for (int l = 0; l <= m_amrlevel.level; ++l)
    {
        amrLevels[l]->state[m_index].RegisterData(m_mfcd, m_mfid[l]);
    }
    for (int i = 0, N = m_leveldata.boxArray().size(); i < N; ++i)
    {
        //
        // A couple typedefs we'll use in the next code segment.
        //
        typedef std::map<int,Vector<Vector<Box> > >::value_type IntAABoxMapValType;

        typedef std::map<int,Vector<Vector<Vector<FillBoxId> > > >::value_type IntAAAFBIDMapValType;

        if (m_leveldata.DistributionMap()[i] != MyProc) continue;
        //
        // Insert with a hint since the indices are ordered lowest to highest.
        //
        IntAAAFBIDMapValType v1(i,Vector<Vector<Vector<FillBoxId> > >());

        m_fbid.insert(m_fbid.end(),v1)->second.resize(m_amrlevel.level+1);

        IntAABoxMapValType v2(i,Vector<Vector<Box> >());

        m_fbox.insert(m_fbox.end(),v2)->second.resize(m_amrlevel.level+1);
        m_cbox.insert(m_cbox.end(),v2)->second.resize(m_amrlevel.level+1);

        m_ba.insert(m_ba.end(),std::map<int,Box>::value_type(i,amrex::grow(m_leveldata.boxArray()[i],m_growsize)));
    }

    BoxList        tempUnfillable(boxType);
    BoxList        unfillableThisLevel(boxType);
    Vector<Box>     unfilledThisLevel;
    Vector<Box>     crse_boxes;
    Vector<IntVect> pshifts(27);

    for (std::map<int,Box>::const_iterator it = m_ba.begin(), End = m_ba.end();
         it != End;
         ++it)
    {
        const int  bxidx = it->first;
        const Box& box   = it->second;

        unfilledThisLevel.clear();
        unfilledThisLevel.push_back(box);

        if (!topPDomain.contains(box))
        {
            unfilledThisLevel.back() &= topPDomain;

            if (topLevel.geom.isAnyPeriodic())
            {
                //
                // May need to add additional unique pieces of valid region
                // in order to do periodic copies into ghost cells.
                //
                topLevel.geom.periodicShift(topPDomain,box,pshifts);

                for (const auto& iv : pshifts)
                {
                    Box shbox = box + iv;
                    shbox    &= topPDomain;

                    if (boxType.nodeCentered())
                    {
                        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                        {
                            if (iv[dir] > 0)
                            {
                                shbox.growHi(dir,-1);
                            }
                            else if (iv[dir] < 0)
                            {
                                shbox.growLo(dir,-1);
                            }
                        }
                    }

                    if (shbox.ok())
                    {
                        BoxList bl = amrex::boxDiff(shbox,box);

                        unfilledThisLevel.insert(unfilledThisLevel.end(), bl.begin(), bl.end());
                    }
                }
            }
        }

        // cells outside physical boundaries are not included in unfilledThisLevel

        bool Done = false;

        Vector< Vector<Box> >&                TheCrseBoxes = m_cbox[bxidx];
        Vector< Vector<Box> >&                TheFineBoxes = m_fbox[bxidx];
        Vector< Vector< Vector<FillBoxId> > >& TheFBIDs     = m_fbid[bxidx];

        for (int l = m_amrlevel.level; l >= 0 && !Done; --l)
        {
            unfillableThisLevel.clear();

            AmrLevel&       theAmrLevel = *amrLevels[l];
            StateData&      theState    = theAmrLevel.state[m_index];
            const Box&      thePDomain  = theState.getDomain();
            const Geometry& theGeom     = theAmrLevel.geom;
            const bool      is_periodic = theGeom.isAnyPeriodic();
            const IntVect&  fine_ratio  = theAmrLevel.fine_ratio;
            Vector<Box>&     FineBoxes   = TheFineBoxes[l];
            //
            // These are the boxes on this level contained in thePDomain
            // that need to be filled in order to directly fill at the
            // highest level or to interpolate up to the next higher level.
            //
            FineBoxes = unfilledThisLevel;
            //
            // Now build coarse boxes needed to interpolate to fine.
            //
            // If we're periodic and we're not at the finest level, we may
            // need to get some additional data at this level in order to
            // properly fill the CoarseBox()d versions of the fineboxes.
            //
            crse_boxes.clear();

            for (const auto& fbx : FineBoxes)
            {
                crse_boxes.push_back(fbx);

                if (l != m_amrlevel.level)
                {
                    const Box& cbox = m_map->CoarseBox(fbx,fine_ratio);

                    crse_boxes.back() = cbox;

                    if (is_periodic && !thePDomain.contains(cbox))
                    {
                        theGeom.periodicShift(thePDomain,cbox,pshifts);

                        for (const auto& iv : pshifts)
                        {
                            Box shbox = cbox + iv;
                            shbox    &= thePDomain;

                            if (boxType.nodeCentered())
                            {
                                for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                                {
                                    if (iv[dir] > 0)
                                    {
                                        shbox.growHi(dir,-1);
                                    }
                                    else if (iv[dir] < 0)
                                    {
                                        shbox.growLo(dir,-1);
                                    }
                                }
                            }

                            if (shbox.ok())
                            {
                                crse_boxes.push_back(shbox);
                            }
                        }
                    }
                }
            }

            Vector< Vector<FillBoxId> >& FBIDs     = TheFBIDs[l];
            Vector<Box>&                CrseBoxes = TheCrseBoxes[l];

            FBIDs.resize(crse_boxes.size());
            CrseBoxes.resize(crse_boxes.size());
            //
            // Now attempt to get as much coarse data as possible.
            //
            for (int i = 0, M = CrseBoxes.size(); i < M; i++)
            {
                BL_ASSERT(tempUnfillable.isEmpty());

                CrseBoxes[i] = crse_boxes[i];

                BL_ASSERT(CrseBoxes[i].intersects(thePDomain));

                theState.InterpAddBox(m_mfcd,
                                      m_mfid[l],
                                      &tempUnfillable,
                                      FBIDs[i],
                                      CrseBoxes[i],
                                      m_time,
                                      m_scomp,
                                      0,
                                      m_ncomp,
                                      extrap);

                unfillableThisLevel.catenate(tempUnfillable);
            }

            unfillableThisLevel.intersect(thePDomain);

            if (unfillableThisLevel.isEmpty())
            {
                Done = true;
            }
            else
            {
                unfilledThisLevel.clear();

                unfilledThisLevel.insert(unfilledThisLevel.end(),
                                         unfillableThisLevel.begin(),
                                         unfillableThisLevel.end());
            }
        }
    }

    m_mfcd.CollectData();
}